

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O3

void bcf1_sync_info(bcf1_t *line,kstring_t *str)

{
  bcf_info_t *pbVar1;
  bcf_info_t *pbVar2;
  uint8_t *puVar3;
  bcf_info_t *pbVar4;
  undefined8 uVar5;
  uint8_t *puVar6;
  undefined8 uVar7;
  int iVar8;
  int iVar9;
  anon_union_4_2_947300a4_for_v1 aVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  anon_union_4_2_947300a4_for_v1 aVar14;
  ulong uVar15;
  char *pcVar16;
  long lVar17;
  size_t __n;
  uint8_t **ppuVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  size_t __size;
  size_t sVar23;
  uint uVar24;
  bcf_info_t tmp;
  
  if (*(short *)&line->field_0x10 != 0) {
    uVar22 = 0xffffffff;
    uVar19 = 1;
    uVar21 = 0;
    do {
      pbVar2 = (line->d).info;
      puVar3 = pbVar2[uVar21].vptr;
      if (puVar3 == (uint8_t *)0x0) {
        if ((int)uVar22 < 0) {
          uVar22 = uVar21 & 0xffffffff;
        }
      }
      else {
        uVar24 = *(uint *)&pbVar2[uVar21].field_0x1c & 0x7fffffff;
        sVar23 = str->l;
        __n = (size_t)(int)(pbVar2[uVar21].vptr_len + uVar24);
        if (str->m < sVar23 + __n) {
          uVar15 = (sVar23 + __n) - 1;
          uVar15 = uVar15 >> 1 | uVar15;
          uVar15 = uVar15 >> 2 | uVar15;
          uVar15 = uVar15 >> 4 | uVar15;
          uVar15 = uVar15 >> 8 | uVar15;
          __size = (uVar15 >> 0x10 | uVar15) + 1;
          str->m = __size;
          pcVar16 = (char *)realloc(str->s,__size);
          if (pcVar16 != (char *)0x0) {
            str->s = pcVar16;
            sVar23 = str->l;
            goto LAB_00125b4b;
          }
        }
        else {
          pcVar16 = str->s;
LAB_00125b4b:
          memcpy(pcVar16 + sVar23,puVar3 + -(ulong)uVar24,__n);
          str->l = str->l + __n;
        }
        if (-1 < (int)uVar22) {
          pbVar4 = (line->d).info;
          pbVar2 = pbVar4 + uVar22;
          iVar11 = pbVar2->key;
          iVar12 = pbVar2->type;
          iVar13 = pbVar2->len;
          aVar14 = pbVar2->v1;
          puVar3 = pbVar4[uVar22].vptr;
          uVar5 = (&pbVar4[uVar22].vptr)[1];
          pbVar2 = pbVar4 + uVar21;
          iVar8 = pbVar2->type;
          iVar9 = pbVar2->len;
          aVar10 = pbVar2->v1;
          puVar6 = pbVar4[uVar21].vptr;
          uVar7 = (&pbVar4[uVar21].vptr)[1];
          pbVar1 = pbVar4 + uVar22;
          pbVar1->key = pbVar2->key;
          pbVar1->type = iVar8;
          pbVar1->len = iVar9;
          pbVar1->v1 = aVar10;
          pbVar4[uVar22].vptr = puVar6;
          (&pbVar4[uVar22].vptr)[1] = (uint8_t *)uVar7;
          pbVar2 = (line->d).info;
          ppuVar18 = &pbVar2[uVar21].vptr;
          *ppuVar18 = puVar3;
          ppuVar18[1] = (uint8_t *)uVar5;
          pbVar2 = pbVar2 + uVar21;
          pbVar2->key = iVar11;
          pbVar2->type = iVar12;
          pbVar2->len = iVar13;
          pbVar2->v1 = aVar14;
          if (uVar22 <= uVar21) {
            lVar17 = uVar22 << 0x20;
            ppuVar18 = &(line->d).info[uVar22].vptr;
            do {
              if (*ppuVar18 == (uint8_t *)0x0) goto LAB_00125c10;
              lVar20 = lVar17 >> 0x20;
              uVar22 = (ulong)((int)uVar22 + 1);
              lVar17 = lVar17 + 0x100000000;
              ppuVar18 = ppuVar18 + 4;
            } while (lVar20 < (long)uVar21);
            uVar22 = (ulong)uVar19;
          }
        }
      }
LAB_00125c10:
      uVar21 = uVar21 + 1;
      uVar19 = uVar19 + 1;
    } while (uVar21 < (*(ulong *)&line->field_0x10 & 0xffff));
    if (-1 < (int)uVar22) {
      *(ulong *)&line->field_0x10 =
           *(ulong *)&line->field_0x10 & 0xffffffffffff0000 | uVar22 & 0xffff;
    }
  }
  return;
}

Assistant:

static inline void bcf1_sync_info(bcf1_t *line, kstring_t *str)
{
    // pairs of typed vectors
    int i, irm = -1;
    for (i=0; i<line->n_info; i++)
    {
        bcf_info_t *info = &line->d.info[i];
        if ( !info->vptr )
        {
            // marked for removal
            if ( irm < 0 ) irm = i;
            continue;
        }
        kputsn_(info->vptr - info->vptr_off, info->vptr_len + info->vptr_off, str);
        if ( irm >=0 )
        {
            bcf_info_t tmp = line->d.info[irm]; line->d.info[irm] = line->d.info[i]; line->d.info[i] = tmp;
            while ( irm<=i && line->d.info[irm].vptr ) irm++;
        }
    }
    if ( irm>=0 ) line->n_info = irm;
}